

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  uint local_44;
  uint local_34;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 2) {
    enc_local._4_4_ = -1;
  }
  else {
    if (*ptr == '\0') {
      local_34 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
    }
    else {
      local_34 = unicode_byte_type(*ptr,ptr[1]);
    }
    switch(local_34) {
    case 5:
      if ((long)end - (long)ptr < 2) {
        enc_local._4_4_ = -2;
      }
      else {
        *nextTokPtr = ptr;
        enc_local._4_4_ = 0;
      }
      break;
    case 6:
      if ((long)end - (long)ptr < 3) {
        enc_local._4_4_ = -2;
      }
      else {
        *nextTokPtr = ptr;
        enc_local._4_4_ = 0;
      }
      break;
    case 7:
      if ((long)end - (long)ptr < 4) {
        enc_local._4_4_ = -2;
      }
      else {
        *nextTokPtr = ptr;
        enc_local._4_4_ = 0;
      }
      break;
    default:
      *nextTokPtr = ptr;
      enc_local._4_4_ = 0;
      break;
    case 9:
    case 10:
    case 0x15:
    case 0x1e:
      *nextTokPtr = ptr;
      enc_local._4_4_ = 0x16;
      break;
    case 0x1d:
      if ((namingBitmap
           [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(byte)*ptr] * 8 + ((int)(uint)(byte)ptr[1] >> 5))
           ] & 1 << (ptr[1] & 0x1fU)) == 0) {
        *nextTokPtr = ptr;
        return 0;
      }
    case 0x16:
    case 0x18:
      end_local = ptr + 2;
      while (1 < (long)end - (long)end_local) {
        if (*end_local == '\0') {
          local_44 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)end_local[1]);
        }
        else {
          local_44 = unicode_byte_type(*end_local,end_local[1]);
        }
        switch(local_44) {
        case 5:
          if ((long)end - (long)end_local < 2) {
            return -2;
          }
          *nextTokPtr = end_local;
          return 0;
        case 6:
          if ((long)end - (long)end_local < 3) {
            return -2;
          }
          *nextTokPtr = end_local;
          return 0;
        case 7:
          if ((long)end - (long)end_local < 4) {
            return -2;
          }
          *nextTokPtr = end_local;
          return 0;
        default:
          *nextTokPtr = end_local;
          return 0;
        case 0x12:
          *nextTokPtr = end_local + 2;
          return 0x1c;
        case 0x1d:
          if ((namingBitmap
               [(int)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[(byte)*end_local] * 8 +
                     ((int)(uint)(byte)end_local[1] >> 5))] & 1 << (end_local[1] & 0x1fU)) == 0) {
            *nextTokPtr = end_local;
            return 0;
          }
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          end_local = end_local + 2;
        }
      }
      enc_local._4_4_ = -1;
    }
  }
  return enc_local._4_4_;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}